

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzD.cpp
# Opt level: O1

void __thiscall chrono::fea::ChNodeFEAxyzD::SetNoSpeedNoAcceleration(ChNodeFEAxyzD *this)

{
  ChNodeFEAxyz::SetNoSpeedNoAcceleration(&this->super_ChNodeFEAxyz);
  if (this != (ChNodeFEAxyzD *)&Q_ROTATE_Y_TO_Z) {
    (this->D_dt).m_data[0] = VNULL;
    (this->D_dt).m_data[1] = DAT_00b90ac0;
    (this->D_dt).m_data[2] = DAT_00b90ac8;
  }
  if (this != (ChNodeFEAxyzD *)&DAT_00b90998) {
    (this->D_dtdt).m_data[0] = VNULL;
    (this->D_dtdt).m_data[1] = DAT_00b90ac0;
    (this->D_dtdt).m_data[2] = DAT_00b90ac8;
  }
  return;
}

Assistant:

void ChNodeFEAxyzD::SetNoSpeedNoAcceleration() {
    ChNodeFEAxyz::SetNoSpeedNoAcceleration();

    D_dt = VNULL;
    D_dtdt = VNULL;
}